

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O1

int check_not_in_range(unsigned_long value,unsigned_long check_value_data)

{
  bool bVar1;
  bool bVar2;
  
  if (check_value_data != 0) {
    bVar1 = value < *(ulong *)(check_value_data + 0x28);
    bVar2 = *(ulong *)(check_value_data + 0x30) < value;
    if (!bVar2 && !bVar1) {
      cm_print_error("%lu is within the range %lu-%lu\n",value);
    }
    return (uint)(bVar2 || bVar1);
  }
  cm_print_error("%s\n","check_integer_range");
  _fail("/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/build_O1/_deps/cmocka-src/src/cmocka.c"
        ,0x5b1);
}

Assistant:

static int check_not_in_range(const LargestIntegralType value,
                              const LargestIntegralType check_value_data) {
    CheckIntegerRange * const check_integer_range =
        cast_largest_integral_type_to_pointer(CheckIntegerRange*,
                                              check_value_data);
    assert_non_null(check_integer_range);
    return integer_not_in_range_display_error(
        value, check_integer_range->minimum, check_integer_range->maximum);
}